

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

char * sx_strcpy(char *dst,int dst_sz,char *src)

{
  code *pcVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  
  if (dst == (char *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0x58,"dst");
    pcVar1 = (code *)swi(3);
    pcVar3 = (char *)(*pcVar1)();
    return pcVar3;
  }
  if (src == (char *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/string.c",
                      0x59,"src");
    pcVar1 = (code *)swi(3);
    pcVar3 = (char *)(*pcVar1)();
    return pcVar3;
  }
  uVar2 = sx_strlen(src);
  uVar4 = dst_sz - 1U;
  if ((int)uVar2 < (int)(dst_sz - 1U)) {
    uVar4 = uVar2;
  }
  if (0 < (int)uVar4) {
    memcpy(dst,src,(ulong)uVar4);
  }
  dst[(int)uVar4] = '\0';
  return dst + (int)uVar4;
}

Assistant:

char* sx_strcpy(char* SX_RESTRICT dst, int dst_sz, const char* SX_RESTRICT src)
{
    sx_assert(dst);
    sx_assert(src);

    const int len = sx_strlen(src);
    const int32_t max = dst_sz - 1;
    const int32_t num = (len < max ? len : max);
    if (num > 0) {
        sx_memcpy(dst, src, num);
    }
    dst[num] = '\0';

    return &dst[num];
}